

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImVec2 __thiscall
ImFont::CalcTextSizeA
          (ImFont *this,float size,float max_width,float wrap_width,char *text_begin,char *text_end,
          char **remaining)

{
  ImVec2 IVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  float fVar8;
  int iVar9;
  size_t sVar10;
  char *pcVar11;
  float *pfVar12;
  char *text;
  char *pcVar13;
  float scale;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  uint uVar18;
  float fVar19;
  uint c;
  uint local_60;
  float local_5c;
  float local_58;
  float fStack_54;
  uint uStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  uint uStack_40;
  float fStack_3c;
  char **local_38;
  
  local_5c = max_width;
  local_38 = remaining;
  if (text_end == (char *)0x0) {
    sVar10 = strlen(text_begin);
    text_end = text_begin + sVar10;
  }
  scale = size / this->FontSize;
  pcVar11 = (char *)0x0;
  fVar16 = 0.0;
  fVar17 = 0.0;
  uVar18 = 0;
  fVar19 = 0.0;
  fVar15 = 0.0;
  uVar2 = 0;
  uVar3 = 0;
  uVar4 = 0;
  fVar5 = 0.0;
  fVar6 = 0.0;
  uVar7 = 0;
  fVar8 = 0.0;
LAB_001e3391:
  do {
    fStack_3c = fVar8;
    uStack_40 = uVar7;
    fStack_44 = fVar6;
    local_48 = fVar5;
    fStack_4c = (float)uVar4;
    uStack_50 = uVar3;
    fStack_54 = (float)uVar2;
    local_58 = fVar15;
    text = text_begin;
    pcVar13 = text;
    fVar14 = fVar17;
    if (text_end <= text) goto LAB_001e351e;
    if (0.0 < wrap_width) {
      if (pcVar11 == (char *)0x0) {
        pcVar11 = CalcWordWrapPositionA(this,scale,text,text_end,wrap_width - local_58);
        fVar16 = local_48;
        fVar17 = fStack_44;
        uVar18 = uStack_40;
        fVar19 = fStack_3c;
      }
      if (pcVar11 <= text) {
        if (fVar16 < local_58) {
          fVar16 = local_58;
        }
        fStack_54 = fVar17 + size;
        local_58 = fVar16;
        uStack_50 = uVar18;
        fStack_4c = fVar19;
        text_begin = CalcWordWrapNextLineStartA(text,text_end);
        pcVar11 = (char *)0x0;
        fVar16 = local_58;
        fVar17 = fStack_54;
        uVar18 = uStack_50;
        fVar19 = fStack_4c;
        fVar15 = 0.0;
        uVar2 = 0;
        uVar3 = 0;
        uVar4 = 0;
        fVar5 = local_58;
        fVar6 = fStack_54;
        uVar7 = uStack_50;
        fVar8 = fStack_4c;
        goto LAB_001e3391;
      }
    }
    local_60 = (uint)*text;
    if (*text < '\0') {
      iVar9 = ImTextCharFromUtf8(&local_60,text,text_end);
      pcVar13 = text + iVar9;
      fVar16 = local_48;
      fVar14 = fStack_44;
      uVar18 = uStack_40;
      fVar19 = fStack_3c;
      if (local_60 == 0) goto LAB_001e351e;
    }
    else {
      pcVar13 = text + 1;
      fVar14 = fVar17;
    }
    text_begin = pcVar13;
    fVar17 = fVar14;
    if (local_60 < 0x20) {
      fVar15 = local_58;
      uVar2 = (uint)fStack_54;
      uVar3 = uStack_50;
      uVar4 = fStack_4c;
      fVar5 = fVar16;
      fVar6 = fVar14;
      uVar7 = uVar18;
      fVar8 = fVar19;
      if (local_60 == 0xd) goto LAB_001e3391;
      if (local_60 == 10) {
        fVar16 = (float)(~-(uint)(local_58 <= fVar16) & (uint)local_58 |
                        -(uint)(local_58 <= fVar16) & (uint)fVar16);
        fVar17 = fVar14 + size;
        uVar18 = (uint)fStack_54 & (uint)fVar14;
        fVar19 = fVar14;
        fVar15 = 0.0;
        uVar2 = 0;
        uVar3 = 0;
        uVar4 = 0;
        fVar5 = fVar16;
        fVar6 = fVar14 + size;
        uVar7 = (uint)fStack_54 & (uint)fVar14;
        fVar8 = fVar14;
        goto LAB_001e3391;
      }
    }
    pfVar12 = (this->IndexAdvanceX).Data + local_60;
    if ((this->IndexAdvanceX).Size <= (int)local_60) {
      pfVar12 = &this->FallbackAdvanceX;
    }
    fVar15 = *pfVar12 * scale + local_58;
    pcVar13 = text;
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    fVar5 = local_48;
    fVar6 = fStack_44;
    uVar7 = uStack_40;
    fVar8 = fStack_3c;
    if (local_5c <= fVar15) {
LAB_001e351e:
      if (local_38 != (char **)0x0) {
        *local_38 = pcVar13;
      }
      if (fVar16 < local_58) {
        fVar16 = local_58;
      }
      if (fVar14 == 0.0 || 0.0 < local_58) {
        fVar14 = fVar14 + size;
      }
      IVar1.y = fVar14;
      IVar1.x = fVar16;
      return IVar1;
    }
  } while( true );
}

Assistant:

ImVec2 ImFont::CalcTextSizeA(float size, float max_width, float wrap_width, const char* text_begin, const char* text_end, const char** remaining) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // FIXME-OPT: Need to avoid this.

    const float line_height = size;
    const float scale = size / FontSize;

    ImVec2 text_size = ImVec2(0, 0);
    float line_width = 0.0f;

    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    const char* s = text_begin;
    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - line_width);

            if (s >= word_wrap_eol)
            {
                if (text_size.x < line_width)
                    text_size.x = line_width;
                text_size.y += line_height;
                line_width = 0.0f;
                word_wrap_eol = NULL;
                s = CalcWordWrapNextLineStartA(s, text_end); // Wrapping skips upcoming blanks
                continue;
            }
        }

        // Decode and advance source
        const char* prev_s = s;
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                text_size.x = ImMax(text_size.x, line_width);
                text_size.y += line_height;
                line_width = 0.0f;
                continue;
            }
            if (c == '\r')
                continue;
        }

        const float char_width = ((int)c < IndexAdvanceX.Size ? IndexAdvanceX.Data[c] : FallbackAdvanceX) * scale;
        if (line_width + char_width >= max_width)
        {
            s = prev_s;
            break;
        }

        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (line_width > 0 || text_size.y == 0.0f)
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}